

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz.h
# Opt level: O2

size_t __thiscall GF2::ZZ<130UL>::Log(ZZ<130UL> *this)

{
  size_t k;
  size_t sVar1;
  ulong uVar2;
  
  uVar2 = 0x82;
  do {
    sVar1 = uVar2;
    if (uVar2 == 0) {
      return sVar1;
    }
    uVar2 = uVar2 - 1;
  } while (((this->super_WW<130UL>)._words[uVar2 >> 6] >> (uVar2 & 0x3f) & 1) == 0);
  return sVar1;
}

Assistant:

size_t Log() const
	{
		size_t k = _n;
		while (k)
            if (Test(k - 1)) 
				return k;
			else 
				--k;
		return k;		
	}